

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCopyToFile::Deserialize(LogicalCopyToFile *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  undefined1 uVar5;
  CopyFunctionReturnType CVar6;
  undefined1 write_part_cols;
  PreserveOrderType PVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ClientContext *context;
  pointer pLVar13;
  InternalException *pIVar14;
  long lVar15;
  _func_int **pp_Var16;
  templated_unique_single_t result;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> copy_info;
  vector<unsigned_long,_true> partition_columns;
  string default_extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<duckdb::LogicalType,_true> expected_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::LogicalType,_true> types_to_write;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names_to_write;
  FilenamePattern filename_pattern;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_path;
  CopyFunction function;
  bool local_4c5;
  CopyOverwriteMode local_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [24];
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_498;
  undefined1 local_490 [16];
  iterator iStack_480;
  _Elt_pointer local_478;
  undefined1 local_468 [8];
  _Alloc_hider local_460;
  _Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_> local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  __uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  local_440;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  undefined1 local_3f8 [8];
  string local_3f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a0;
  vector<duckdb::LogicalType,_true> local_388;
  FilenamePattern local_370;
  reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>
  *local_340 [2];
  reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>
  local_330 [2];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [216];
  SimpleNamedParameterFunction local_208 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"file_path");
  (*deserializer->_vptr_Deserializer[0x1a])(local_340,deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"use_tmp_file");
  iVar8 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xca,"filename_pattern");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  FilenamePattern::Deserialize(&local_370,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcb,"overwrite_mode");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_2e0,deserializer);
    local_4c4 = EnumUtil::FromString<duckdb::CopyOverwriteMode>((char *)local_2e0._0_8_);
    if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
      operator_delete((void *)local_2e0._0_8_);
    }
  }
  else {
    iVar9 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    local_4c4 = (CopyOverwriteMode)iVar9;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcc,"per_thread_output");
  iVar9 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcd,"partition_output");
  iVar10 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xce,"partition_columns");
  local_490._8_8_ = (void *)0x0;
  iStack_480._M_current = (unsigned_long *)0x0;
  local_478 = (_Elt_pointer)0x0;
  iVar11 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar15 = CONCAT44(extraout_var,iVar11);
  if (lVar15 != 0) {
    do {
      iVar11 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
      local_2e0._0_8_ = CONCAT44(extraout_var_00,iVar11);
      if ((_Elt_pointer)iStack_480._M_current == local_478) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_490 + 8),
                   iStack_480,(unsigned_long *)local_2e0);
      }
      else {
        *iStack_480._M_current = local_2e0._0_8_;
        iStack_480._M_current = iStack_480._M_current + 1;
      }
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&local_3b8,deserializer,0xcf,"names");
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_3d0,deserializer,0xd0,"expected_types");
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xd1,"copy_info");
  iVar11 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar11 == '\0') {
    pp_Var16 = (_func_int **)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    ParseInfo::Deserialize((ParseInfo *)local_2e0,deserializer);
    pp_Var16 = (_func_int **)local_2e0._0_8_;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_490._0_8_ = pp_Var16;
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xd2,"function_name");
  (*deserializer->_vptr_Deserializer[0x1a])(local_3f8 + 8,deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pp_Var16 = (_func_int **)(local_2e0 + 0x10);
  local_2e0._0_8_ = pp_Var16;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"system","");
  local_4c0._0_8_ = local_4b0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"main","");
  local_460._M_p =
       (pointer)Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                          (context,(string *)local_2e0,(string *)local_4c0,(string *)(local_3f8 + 8)
                           ,THROW_EXCEPTION,(QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> *)&local_460);
  _Var4._M_p = local_460._M_p;
  if ((type)local_4c0._0_8_ != (type)local_4b0) {
    operator_delete((void *)local_4c0._0_8_);
  }
  if ((_func_int **)local_2e0._0_8_ != pp_Var16) {
    operator_delete((void *)local_2e0._0_8_);
  }
  if (_Var4._M_p[0x10] == COPY_FUNCTION_ENTRY) {
    CopyFunction::CopyFunction((CopyFunction *)local_2e0,(CopyFunction *)(_Var4._M_p + 0x120));
    local_498._M_head_impl = (FunctionData *)0x0;
    (*deserializer->_vptr_Deserializer[2])(deserializer,0xd3,"function_has_serialize");
    iVar11 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    if ((char)iVar11 != '\0') {
      (*deserializer->_vptr_Deserializer[2])(deserializer,0xd4,"function_data");
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      (*(code *)local_2e0._200_8_)((Deserializer *)local_4c0,(CopyFunction *)deserializer);
      _Var2._M_head_impl = local_498._M_head_impl;
      local_498._M_head_impl = (FunctionData *)local_4c0._0_8_;
      local_4c0._0_8_ = (type)0x0;
      if ((type)_Var2._M_head_impl != (type)0x0) {
        (*((ParseInfo *)&(_Var2._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
      }
      if ((type)local_4c0._0_8_ != (type)0x0) {
        (**(code **)(*(long *)local_4c0._0_8_ + 8))();
      }
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      (*deserializer->_vptr_Deserializer[3])(deserializer);
    }
    local_460._M_p = (pointer)&local_450;
    local_400._M_p = (pointer)context;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,local_50._M_p,local_50._M_p + local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_p == &local_450) {
      local_430._8_4_ = local_450._8_4_;
      local_430._12_4_ = local_450._12_4_;
      local_440._M_t.
      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
           (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
            )(tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              )&local_430;
    }
    else {
      local_440._M_t.
      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
           (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
            )(tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              )local_460._M_p;
    }
    local_430._M_allocated_capacity._4_4_ = local_450._M_allocated_capacity._4_4_;
    local_430._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_;
    local_438 = local_458.super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
    local_458.super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Logger_*,_false>)(Logger *)0x0;
    local_450._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_ & 0xffffff00;
    local_460._M_p = (pointer)&local_450;
    iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd5,"file_extension");
    if ((char)iVar12 == '\0') {
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
      local_420._M_allocated_capacity = (size_type)&local_410;
      if (local_440._M_t.
          super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
          .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl ==
          (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
           )&local_430) {
        local_410._8_8_ = CONCAT44(local_430._12_4_,local_430._8_4_);
      }
      else {
        local_420._M_allocated_capacity =
             (size_type)
             local_440._M_t.
             super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
             .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
      }
      local_420._8_8_ = local_438._M_head_impl;
      local_438._M_head_impl = (Logger *)0x0;
      local_430._M_allocated_capacity = local_430._M_allocated_capacity & 0xffffffffffffff00;
      local_440._M_t.
      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
           (tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
            )(tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
              )&local_430;
    }
    else {
      (*deserializer->_vptr_Deserializer[0x1a])(&local_420,deserializer);
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    if (local_440._M_t.
        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
         )&local_430) {
      operator_delete((void *)local_440._M_t.
                              super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                              .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>.
                              _M_head_impl);
    }
    iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd6,"rotate");
    if ((char)iVar12 == '\0') {
      uVar5 = false;
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    }
    else {
      iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
      uVar5 = (undefined1)iVar12;
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd7,"return_type");
    if ((char)iVar12 == '\0') {
      CVar6 = CHANGED_ROWS;
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    }
    else {
      if (deserializer->deserialize_enum_from_string == true) {
        (*deserializer->_vptr_Deserializer[0x1a])(local_4c0,deserializer);
        CVar6 = EnumUtil::FromString<duckdb::CopyFunctionReturnType>((char *)local_4c0._0_8_);
        if ((type)local_4c0._0_8_ != (type)local_4b0) {
          operator_delete((void *)local_4c0._0_8_);
        }
      }
      else {
        iVar12 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
        CVar6 = (CopyFunctionReturnType)iVar12;
      }
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd8,"write_partition_columns");
    if ((char)iVar12 == '\0') {
      write_part_cols = true;
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    }
    else {
      iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
      write_part_cols = (undefined1)iVar12;
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd9,"write_empty_file");
    if ((char)iVar12 == '\0') {
      local_4c5 = true;
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    }
    else {
      iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
      local_4c5 = SUB41(iVar12,0);
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    local_3f8 = (undefined1  [8])this;
    iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xda,"preserve_order");
    if ((char)iVar12 == '\0') {
      PVar7 = AUTOMATIC;
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    }
    else {
      if (deserializer->deserialize_enum_from_string == true) {
        (*deserializer->_vptr_Deserializer[0x1a])(local_4c0,deserializer);
        PVar7 = EnumUtil::FromString<duckdb::PreserveOrderType>((char *)local_4c0._0_8_);
        if ((type)local_4c0._0_8_ != (type)local_4b0) {
          operator_delete((void *)local_4c0._0_8_);
        }
      }
      else {
        iVar12 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
        PVar7 = (PreserveOrderType)iVar12;
      }
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    if ((char)iVar11 == '\0') {
      if ((_Map_pointer)local_2e0._88_8_ == (_Map_pointer)0x0) {
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        local_4c0._0_8_ = local_4b0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4c0,"Copy function \"%s\" has neither bind nor (de)serialize","")
        ;
        local_320._0_8_ = local_320 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_320,local_2e0._8_8_,(pointer)(local_2e0._8_8_ + local_2e0._16_8_)
                  );
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar14,(string *)local_4c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
        __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_4c0._0_8_ =
           unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      local_490);
      local_4b0._0_8_ = (_func_int **)0x0;
      local_4b0[8] = ALTER_INFO;
      local_4c0._8_8_ = (pointer)(local_4b0 + 8);
      GetNamesWithoutPartitions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_388,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_3b8,(vector<unsigned_long,_true> *)(local_490 + 8),(bool)write_part_cols)
      ;
      GetTypesWithoutPartitions
                ((vector<duckdb::LogicalType,_true> *)&local_3a0,
                 (vector<duckdb::LogicalType,_true> *)&local_3d0,
                 (vector<unsigned_long,_true> *)(local_490 + 8),(bool)write_part_cols);
      (*(code *)local_2e0._88_8_)
                ((ClientContext *)local_468,(CopyFunctionBindInput *)local_400._M_p,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_4c0,&local_388);
      auVar3 = local_468;
      _Var2._M_head_impl = local_498._M_head_impl;
      local_468 = (undefined1  [8])0x0;
      local_498._M_head_impl = (FunctionData *)auVar3;
      if ((type)_Var2._M_head_impl != (type)0x0) {
        (*((ParseInfo *)&(_Var2._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
      }
      if (local_468 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_468 + 8))();
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_388);
      if ((pointer)local_4c0._8_8_ != (pointer)(local_4b0 + 8)) {
        operator_delete((void *)local_4c0._8_8_);
      }
    }
    make_uniq<duckdb::LogicalCopyToFile,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>>
              ((duckdb *)local_4c0,(CopyFunction *)local_2e0,
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               &local_498,
               (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
               local_490);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    ::std::__cxx11::string::_M_assign((string *)&pLVar13->file_path);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->use_tmp_file = SUB41(iVar8,0);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    ::std::__cxx11::string::_M_assign((string *)&pLVar13->filename_pattern);
    (pLVar13->filename_pattern).uuid = local_370.uuid;
    (pLVar13->filename_pattern).pos = local_370.pos;
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    ::std::__cxx11::string::_M_assign((string *)&pLVar13->file_extension);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->overwrite_mode = local_4c4;
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->per_thread_output = SUB41(iVar9,0);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->partition_output = SUB41(iVar10,0);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pLVar13->partition_columns).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_490 + 8));
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pLVar13->names,&local_3b8);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pLVar13->expected_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_3d0);
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->rotate = (bool)uVar5;
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->return_type = CVar6;
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->write_partition_columns = (bool)write_part_cols;
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    pLVar13->write_empty_file = local_4c5;
    pLVar13 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c0);
    auVar3 = local_3f8;
    uVar1 = local_4c0._0_8_;
    pLVar13->preserve_order = PVar7;
    local_4c0._0_8_ = (pointer)0x0;
    *(undefined8 *)local_3f8 = uVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_allocated_capacity != &local_410) {
      operator_delete((void *)local_420._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_p != &local_450) {
      operator_delete(local_460._M_p);
    }
    if ((type)local_498._M_head_impl != (type)0x0) {
      (*((ParseInfo *)&(local_498._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
    }
    local_2e0._0_8_ = &PTR__CopyFunction_024790d0;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    local_208[0].super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__TableFunction_02477bc0;
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
    SimpleNamedParameterFunction::~SimpleNamedParameterFunction(local_208);
    Function::~Function((Function *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    if ((_func_int **)local_490._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_490._0_8_ + 8))();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3b8);
    if ((void *)local_490._8_8_ != (void *)0x0) {
      operator_delete((void *)local_490._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.base._M_dataplus._M_p != &local_370.base.field_2) {
      operator_delete(local_370.base._M_dataplus._M_p);
    }
    if (local_340[0] != local_330) {
      operator_delete(local_340[0]);
    }
    return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           auVar3;
  }
  pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
  local_2e0._0_8_ = pp_Var16;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e0,"DeserializeFunction - cant find catalog entry for function %s","")
  ;
  local_300._0_8_ = local_300 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_300,local_3f0._M_dataplus._M_p,
             (undefined1 *)(local_3f0._M_string_length + (long)local_3f0._M_dataplus._M_p));
  InternalException::InternalException<std::__cxx11::string>
            (pIVar14,(string *)local_2e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
  __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<LogicalOperator> LogicalCopyToFile::Deserialize(Deserializer &deserializer) {
	auto file_path = deserializer.ReadProperty<string>(200, "file_path");
	auto use_tmp_file = deserializer.ReadProperty<bool>(201, "use_tmp_file");
	auto filename_pattern = deserializer.ReadProperty<FilenamePattern>(202, "filename_pattern");
	auto overwrite_mode = deserializer.ReadProperty<CopyOverwriteMode>(203, "overwrite_mode");
	auto per_thread_output = deserializer.ReadProperty<bool>(204, "per_thread_output");
	auto partition_output = deserializer.ReadProperty<bool>(205, "partition_output");
	auto partition_columns = deserializer.ReadProperty<vector<idx_t>>(206, "partition_columns");
	auto names = deserializer.ReadProperty<vector<string>>(207, "names");
	auto expected_types = deserializer.ReadProperty<vector<LogicalType>>(208, "expected_types");
	auto copy_info =
	    unique_ptr_cast<ParseInfo, CopyInfo>(deserializer.ReadProperty<unique_ptr<ParseInfo>>(209, "copy_info"));

	// Deserialize function
	auto &context = deserializer.Get<ClientContext &>();
	auto name = deserializer.ReadProperty<string>(210, "function_name");

	auto &func_catalog_entry =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, SYSTEM_CATALOG, DEFAULT_SCHEMA, name);
	if (func_catalog_entry.type != CatalogType::COPY_FUNCTION_ENTRY) {
		throw InternalException("DeserializeFunction - cant find catalog entry for function %s", name);
	}
	auto &function_entry = func_catalog_entry.Cast<CopyFunctionCatalogEntry>();
	auto function = function_entry.function;
	// Deserialize function data
	unique_ptr<FunctionData> bind_data;
	auto has_serialize = deserializer.ReadProperty<bool>(211, "function_has_serialize");
	if (has_serialize) {
		// Just deserialize the bind data
		deserializer.ReadObject(212, "function_data",
		                        [&](Deserializer &obj) { bind_data = function.deserialize(obj, function); });
	}

	auto default_extension = function.extension;

	auto file_extension =
	    deserializer.ReadPropertyWithExplicitDefault<string>(213, "file_extension", std::move(default_extension));

	auto rotate = deserializer.ReadPropertyWithExplicitDefault(214, "rotate", false);
	auto return_type =
	    deserializer.ReadPropertyWithExplicitDefault(215, "return_type", CopyFunctionReturnType::CHANGED_ROWS);
	auto write_partition_columns = deserializer.ReadPropertyWithExplicitDefault(216, "write_partition_columns", true);
	auto write_empty_file = deserializer.ReadPropertyWithExplicitDefault(217, "write_empty_file", true);
	auto preserve_order =
	    deserializer.ReadPropertyWithExplicitDefault(218, "preserve_order", PreserveOrderType::AUTOMATIC);

	if (!has_serialize) {
		// If not serialized, re-bind with the copy info
		if (!function.copy_to_bind) {
			throw InternalException("Copy function \"%s\" has neither bind nor (de)serialize", function.name);
		}

		CopyFunctionBindInput function_bind_input(*copy_info);
		auto names_to_write = GetNamesWithoutPartitions(names, partition_columns, write_partition_columns);
		auto types_to_write = GetTypesWithoutPartitions(expected_types, partition_columns, write_partition_columns);
		bind_data = function.copy_to_bind(context, function_bind_input, names_to_write, types_to_write);
	}

	auto result = make_uniq<LogicalCopyToFile>(function, std::move(bind_data), std::move(copy_info));
	result->file_path = file_path;
	result->use_tmp_file = use_tmp_file;
	result->filename_pattern = filename_pattern;
	result->file_extension = file_extension;
	result->overwrite_mode = overwrite_mode;
	result->per_thread_output = per_thread_output;
	result->partition_output = partition_output;
	result->partition_columns = partition_columns;
	result->names = names;
	result->expected_types = expected_types;
	result->rotate = rotate;
	result->return_type = return_type;
	result->write_partition_columns = write_partition_columns;
	result->write_empty_file = write_empty_file;
	result->preserve_order = preserve_order;

	return std::move(result);
}